

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O0

void __thiscall pstore::broker::gc_watch_thread::start_vacuum(gc_watch_thread *this,string *db_path)

{
  undefined8 left;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  string local_c0 [32];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined8 local_80;
  int local_74;
  not_null<const_char_*> local_70;
  quoted local_68;
  not_null<const_char_*> local_60;
  quoted local_58;
  undefined4 local_4c;
  not_null<const_char_*> local_48;
  quoted local_40 [3];
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  string *db_path_local;
  gc_watch_thread *this_local;
  
  lock._8_8_ = db_path;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mut_);
  bVar1 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
          ::presentl(&this->processes_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_
                    );
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    gsl::not_null<const_char_*>::not_null(&local_48,pcVar3);
    logger::quoted::quoted(local_40,local_48);
    log<pstore::logger::quoted>(info,"GC process is already running for ",local_40[0]);
    local_4c = 1;
  }
  else {
    sVar2 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
            ::size(&this->processes_);
    if (sVar2 < 0x32) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      gsl::not_null<const_char_*>::not_null(&local_70,pcVar3);
      logger::quoted::quoted(&local_68,local_70);
      log<pstore::logger::quoted>(info,"Starting GC process for ",local_68);
      left = lock._8_8_;
      vacuumd_path_abi_cxx11_();
      local_a0 = std::__cxx11::string::c_str();
      local_98 = std::__cxx11::string::c_str();
      local_90 = 0;
      local_88 = &local_a0;
      local_80 = 3;
      local_74 = (*this->_vptr_gc_watch_thread[2])(this,local_88,3);
      bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
      ::set(&this->processes_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)left,&local_74);
      std::__cxx11::string::~string(local_c0);
      signal_cv::notify_all(&this->cv_,-1);
      local_4c = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      gsl::not_null<const_char_*>::not_null(&local_60,pcVar3);
      logger::quoted::quoted(&local_58,local_60);
      log<pstore::logger::quoted>
                (info,"Maximum number of GC processes are running. Ignoring request for ",local_58);
      local_4c = 1;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void gc_watch_thread::start_vacuum (std::string const & db_path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (processes_.presentl (db_path)) {
                log (priority::info, "GC process is already running for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }

            if (processes_.size () >= max_gc_processes) {
                log (priority::info,
                     "Maximum number of GC processes are running. Ignoring request for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }
            log (priority::info, "Starting GC process for ", logger::quoted{db_path.c_str ()});
            processes_.set (db_path,
                            this->spawn ({vacuumd_path ().c_str (), db_path.c_str (), nullptr}));

            // An initial wakeup of the GC-watcher thread in case the child process exited
            // before we had time to install the SIGCHLD signal handler.
            cv_.notify_all (-1);
        }